

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_once_cb(int fd,short events,void *arg)

{
  event_once *eonce;
  void *arg_local;
  short events_local;
  int fd_local;
  
  (**(code **)((long)arg + 0x90))(fd,(int)events,*(undefined8 *)((long)arg + 0x98),events);
  if (*(long *)(*(long *)((long)arg + 0x50) + 0x1b0) != 0) {
    (*evthread_lock_fns_.lock)(0,*(void **)(*(long *)((long)arg + 0x50) + 0x1b0));
  }
  if (*arg != 0) {
    *(undefined8 *)(*arg + 8) = *(undefined8 *)((long)arg + 8);
  }
  **(undefined8 **)((long)arg + 8) = *arg;
  if (*(long *)(*(long *)((long)arg + 0x50) + 0x1b0) != 0) {
    (*evthread_lock_fns_.unlock)(0,*(void **)(*(long *)((long)arg + 0x50) + 0x1b0));
  }
  event_debug_unassign((event *)((long)arg + 0x10));
  event_mm_free_(arg);
  return;
}

Assistant:

static void
event_once_cb(evutil_socket_t fd, short events, void *arg)
{
	struct event_once *eonce = arg;

	(*eonce->cb)(fd, events, eonce->arg);
	EVBASE_ACQUIRE_LOCK(eonce->ev.ev_base, th_base_lock);
	LIST_REMOVE(eonce, next_once);
	EVBASE_RELEASE_LOCK(eonce->ev.ev_base, th_base_lock);
	event_debug_unassign(&eonce->ev);
	mm_free(eonce);
}